

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_brdf.h
# Opt level: O0

int __thiscall
djb::fresnel::schlick::clone
          (schlick *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  schlick *this_00;
  schlick *this_local;
  
  this_00 = (schlick *)operator_new(0x18);
  schlick(this_00,this);
  return (int)this_00;
}

Assistant:

impl *clone() const {return new schlick(*this);}